

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phashtable.c
# Opt level: O3

PList * p_hash_table_keys(PHashTable *table)

{
  PList *list;
  ulong uVar1;
  ulong uVar2;
  PHashTableNode *pPVar3;
  
  if (table != (PHashTable *)0x0) {
    uVar1 = table->size;
    uVar2 = 0;
    list = (PList *)0x0;
    if (uVar1 != 0) {
      do {
        pPVar3 = table->table[uVar2];
        if (pPVar3 != (PHashTableNode *)0x0) {
          do {
            list = p_list_append(list,pPVar3->key);
            pPVar3 = pPVar3->next;
          } while (pPVar3 != (PHashTableNode *)0x0);
          uVar1 = table->size;
        }
        uVar2 = (ulong)((int)uVar2 + 1);
      } while (uVar2 < uVar1);
    }
    return list;
  }
  return (PList *)0x0;
}

Assistant:

P_LIB_API PList *
p_hash_table_keys (const PHashTable *table)
{
	PList		*ret = NULL;
	PHashTableNode	*node;
	puint		i;

	if (P_UNLIKELY (table == NULL))
		return NULL;

	for (i = 0; i < table->size; ++i)
		for (node = table->table[i]; node != NULL; node = node->next)
			ret = p_list_append (ret, node->key);

	return ret;
}